

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O0

int __thiscall
glcts::DrawElementsBaseVertexTests::init(DrawElementsBaseVertexTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  DrawElementsBaseVertexNegativeActiveTransformFeedbackTest *this_00;
  DrawElementsBaseVertexTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior::
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior
            ((DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior2::
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior2
            ((DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior2 *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorAEPShaderStages::
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorAEPShaderStages
            ((DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorAEPShaderStages *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorUnderflow::
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorUnderflow
            ((DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorUnderflow *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorOverflow::
  DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorOverflow
            ((DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorOverflow *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (DrawElementsBaseVertexNegativeActiveTransformFeedbackTest *)operator_new(0x410);
  DrawElementsBaseVertexNegativeActiveTransformFeedbackTest::
  DrawElementsBaseVertexNegativeActiveTransformFeedbackTest
            (this_00,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidCountArgumentTest::
  DrawElementsBaseVertexNegativeInvalidCountArgumentTest
            ((DrawElementsBaseVertexNegativeInvalidCountArgumentTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidInstanceCountArgumentTest::
  DrawElementsBaseVertexNegativeInvalidInstanceCountArgumentTest
            ((DrawElementsBaseVertexNegativeInvalidInstanceCountArgumentTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidModeArgumentTest::
  DrawElementsBaseVertexNegativeInvalidModeArgumentTest
            ((DrawElementsBaseVertexNegativeInvalidModeArgumentTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidPrimcountArgumentTest::
  DrawElementsBaseVertexNegativeInvalidPrimcountArgumentTest
            ((DrawElementsBaseVertexNegativeInvalidPrimcountArgumentTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidStartEndArgumentsTest::
  DrawElementsBaseVertexNegativeInvalidStartEndArgumentsTest
            ((DrawElementsBaseVertexNegativeInvalidStartEndArgumentsTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeInvalidTypeArgumentTest::
  DrawElementsBaseVertexNegativeInvalidTypeArgumentTest
            ((DrawElementsBaseVertexNegativeInvalidTypeArgumentTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x408);
  DrawElementsBaseVertexNegativeMappedBufferObjectsTest::
  DrawElementsBaseVertexNegativeMappedBufferObjectsTest
            ((DrawElementsBaseVertexNegativeMappedBufferObjectsTest *)pTVar1,
             (this->super_TestCaseGroupBase).m_context,&(this->super_TestCaseGroupBase).m_extParams)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void DrawElementsBaseVertexTests::init()
{
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehavior2(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorAEPShaderStages(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorUnderflow(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexFunctionalCorrectBaseVertexBehaviorOverflow(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeActiveTransformFeedbackTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidCountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidInstanceCountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidModeArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidPrimcountArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidStartEndArgumentsTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeInvalidTypeArgumentTest(m_context, m_extParams));
	addChild(new DrawElementsBaseVertexNegativeMappedBufferObjectsTest(m_context, m_extParams));
}